

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

bool __thiscall SQClass::SetAttributes(SQClass *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQObjectValue obj;
  bool bVar1;
  SQClassMember *pSVar2;
  undefined1 local_38 [8];
  SQObjectPtr idx;
  SQObjectPtr *val_local;
  SQObjectPtr *key_local;
  SQClass *this_local;
  
  idx.super_SQObject._unVal = (SQObjectValue)val;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_38);
  bVar1 = SQTable::Get(this->_members,key,(SQObjectPtr *)local_38);
  obj = idx.super_SQObject._unVal;
  if (bVar1) {
    if ((idx.super_SQObject._0_8_ & 0x2000000) == 0) {
      pSVar2 = sqvector<SQClassMember>::operator[]
                         (&this->_methods,(ulong)(idx.super_SQObject._type & 0xffffff));
      ::SQObjectPtr::operator=(&pSVar2->attrs,(SQObjectPtr *)obj.pTable);
    }
    else {
      pSVar2 = sqvector<SQClassMember>::operator[]
                         (&this->_defaultvalues,(ulong)(idx.super_SQObject._type & 0xffffff));
      ::SQObjectPtr::operator=(&pSVar2->attrs,(SQObjectPtr *)obj.pTable);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_38);
  return this_local._7_1_;
}

Assistant:

bool SQClass::SetAttributes(const SQObjectPtr &key,const SQObjectPtr &val)
{
    SQObjectPtr idx;
    if(_members->Get(key,idx)) {
        if(_isfield(idx))
            _defaultvalues[_member_idx(idx)].attrs = val;
        else
            _methods[_member_idx(idx)].attrs = val;
        return true;
    }
    return false;
}